

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enctest.cpp
# Opt level: O3

double __thiscall MotionTrajectory::CalculateNextTime(MotionTrajectory *this,int *curDir)

{
  int *piVar1;
  double dVar2;
  MotionBase *pMVar3;
  ulong uVar4;
  ostream *poVar5;
  long *plVar6;
  pointer ppMVar7;
  double extraout_XMM0_Qa;
  double dVar8;
  double extraout_XMM0_Qa_00;
  double dVar9;
  
  pMVar3 = (this->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>.
           _M_impl.super__Vector_impl_data._M_start[this->curIndex];
  piVar1 = &this->pos;
  (*pMVar3->_vptr_MotionBase[2])(this->tCur,pMVar3,piVar1,curDir);
  dVar9 = extraout_XMM0_Qa;
  if (extraout_XMM0_Qa < 0.0) {
    uVar4 = this->curIndex;
    ppMVar7 = (this->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (uVar4 < ((long)(this->motionList).
                       super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)ppMVar7 >> 3) - 1U) {
      do {
        dVar9 = ppMVar7[uVar4]->tf;
        dVar2 = ppMVar7[uVar4]->pf;
        dVar8 = this->tCur;
        if (this->tCur < dVar9) {
          this->tCur = dVar9;
          dVar8 = dVar9;
        }
        dVar9 = 0.999999999;
        if (*curDir != -1) {
          dVar9 = 0.0;
        }
        if (*piVar1 != (int)(dVar9 + dVar2)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"CalculateNextTime: pos = ",0x19);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->pos);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", pf = ",7);
          poVar5 = std::ostream::_M_insert<double>(dVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", dir = ",8);
          plVar6 = (long *)std::ostream::operator<<((ostream *)poVar5,*curDir);
          std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
          std::ostream::put((char)plVar6);
          std::ostream::flush();
          ppMVar7 = (this->motionList).
                    super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar4 = this->curIndex;
          dVar8 = this->tCur;
        }
        this->curIndex = uVar4 + 1;
        (*ppMVar7[uVar4 + 1]->_vptr_MotionBase[2])(dVar8,ppMVar7[uVar4 + 1],piVar1,curDir);
        dVar9 = extraout_XMM0_Qa_00;
        if (0.0 <= extraout_XMM0_Qa_00) break;
        uVar4 = this->curIndex;
        ppMVar7 = (this->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar4 < ((long)(this->motionList).
                              super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppMVar7 >> 3) - 1U);
    }
  }
  if (0.0 <= dVar9) {
    this->tCur = dVar9;
  }
  return dVar9;
}

Assistant:

double MotionTrajectory::CalculateNextTime(int &curDir)
{
    double t = motionList[curIndex]->CalculateNextTime(tCur, pos, curDir);
    while ((t < 0.0) && (curIndex < motionList.size()-1)) {
        double tf, pf, vf, af;
        motionList[curIndex]->GetFinalValues(tf, pf, vf, af);
        if (tCur < tf)
            tCur = tf;
        int endPos = static_cast<int>(pf + ((curDir == -1) ? (1-TINY) : 0));
        if (pos != endPos)
            std::cout << "CalculateNextTime: pos = " << pos << ", pf = " << pf << ", dir = " << curDir << std::endl;
        curIndex++;
        t = motionList[curIndex]->CalculateNextTime(tCur, pos, curDir);
    }
    if (t >= 0.0)
        tCur = t;
    return t;
}